

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadCustomSection
          (BinaryReader *this,Index section_index,Offset section_size)

{
  bool bVar1;
  size_t sVar2;
  Offset OVar3;
  uint uVar4;
  size_t sVar5;
  Result RVar6;
  int iVar7;
  size_type sVar8;
  ulong uVar9;
  Enum EVar10;
  uint32_t uVar11;
  uint uVar12;
  char *pcVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  string_view name;
  Index num_names;
  uint32_t name_type;
  Index num_locals;
  uint32_t value;
  uint32_t table_align;
  uint32_t value_1;
  string_view section_name;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint32_t local_94;
  ulong local_90;
  string_view local_88;
  Offset local_78;
  uint local_70;
  uint local_6c;
  string_view local_68;
  uint local_50;
  uint local_4c;
  string_view local_48;
  uint local_34;
  
  local_48._M_len = 0;
  local_48._M_str = (char *)0x0;
  RVar6 = ReadStr(this,&local_48,"section name");
  pcVar13 = local_48._M_str;
  sVar5 = local_48._M_len;
  if (RVar6.enum_ == Error) {
    return (Result)Error;
  }
  iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[7])
                    (this->delegate_,(ulong)section_index,section_size,local_48._M_len,
                     local_48._M_str);
  if (iVar7 != 0) {
    PrintError(this,"BeginCustomSection callback failed");
    return (Result)Error;
  }
  bVar1 = this->reading_custom_section_;
  this->reading_custom_section_ = true;
  local_78 = (this->state_).offset;
  local_88._M_len = (size_t)(this->state_).data;
  local_88._M_str = (char *)(this->state_).size;
  iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc6])(this->delegate_,section_size);
  if (iVar7 == 0) {
    sVar2 = this->read_end_;
    OVar3 = (this->state_).offset;
    (this->state_).offset = sVar2;
    iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[199])
                      (this->delegate_,sVar5,pcVar13,(this->state_).data + OVar3,sVar2 - OVar3);
    if (iVar7 != 0) {
      pcVar13 = "OnGenericCustomSection callback failed";
      goto LAB_00121b02;
    }
    iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[200])();
    if (iVar7 != 0) {
      pcVar13 = "EndGenericCustomSection callback failed";
      goto LAB_00121b02;
    }
    (this->state_).offset = local_78;
    *(uint *)&(this->state_).data = (uint)local_88._M_len;
    *(undefined4 *)((long)&(this->state_).data + 4) = local_88._M_len._4_4_;
    *(undefined4 *)&(this->state_).size = local_88._M_str._0_4_;
    *(undefined4 *)((long)&(this->state_).size + 4) = local_88._M_str._4_4_;
    if ((sVar5 == 4 & this->options_->read_debug_names) == 1) {
      if (*(int *)pcVar13 != 0x656d616e) goto LAB_00121f6e;
      iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa7])(this->delegate_,section_size);
      if (iVar7 == 0) {
        if ((this->state_).offset < this->read_end_) {
          uVar14 = 0;
          uVar15 = 0;
LAB_00122074:
          RVar6 = ReadU32Leb128(this,&local_98,"name type");
          if (RVar6.enum_ == Error) goto LAB_00121b1e;
          if (uVar14 != 0) {
            if (local_98 == uVar15) {
              pcVar13 = "duplicate sub-section";
              goto LAB_001225ed;
            }
            if (local_98 < uVar15) {
              pcVar13 = "out-of-order sub-section";
              goto LAB_001225ed;
            }
          }
          local_34 = local_98;
          RVar6 = ReadU32Leb128(this,(uint32_t *)&local_88,"subsection size");
          uVar15 = local_98;
          if (RVar6.enum_ == Error) goto LAB_00121b1e;
          uVar9 = local_88._M_len & 0xffffffff;
          uVar16 = (this->state_).offset + uVar9;
          local_90 = this->read_end_;
          local_9c = uVar14;
          if (local_90 < uVar16) goto LAB_001226ba;
          this->read_end_ = uVar16;
          if (((int)local_98 < 0xc) &&
             (iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb1])
                                (this->delegate_,(ulong)uVar14,(ulong)local_98,uVar9), iVar7 != 0))
          {
            pcVar13 = "OnNameSubsection callback failed";
            goto LAB_001228d9;
          }
          uVar14 = local_9c;
          switch(uVar15) {
          case 0:
            iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa8])
                              (this->delegate_,(ulong)local_9c,(ulong)local_98,uVar9);
            if (iVar7 == 0) {
              if (uVar9 != 0) {
                local_88._M_len = 0;
                local_88._M_str = (char *)0x0;
                RVar6 = ReadStr(this,&local_88,"module name");
                if (RVar6.enum_ == Error) goto LAB_001228e3;
                iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa9])
                                  (this->delegate_,local_88._M_len,local_88._M_str);
                uVar14 = local_9c;
                if (iVar7 != 0) {
                  pcVar13 = "OnModuleName callback failed";
                  break;
                }
              }
              goto LAB_001221e9;
            }
            pcVar13 = "OnModuleNameSubsection callback failed";
            break;
          case 1:
            iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xaa])
                              (this->delegate_,(ulong)local_9c,(ulong)local_98,uVar9);
            if (iVar7 == 0) {
              if (uVar9 != 0) {
                RVar6 = ReadCount(this,&local_a0,"name count");
                uVar12 = local_a0;
                if (RVar6.enum_ == Error) goto LAB_001228e3;
                iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xab])
                                  (this->delegate_,(ulong)local_a0);
                if (iVar7 != 0) {
                  pcVar13 = "OnFunctionNamesCount callback failed";
                  break;
                }
                uVar14 = local_9c;
                if (uVar12 != 0) {
                  uVar15 = 0xffffffff;
LAB_00122459:
                  local_88._M_len = 0;
                  local_88._M_str = (char *)0x0;
                  RVar6 = ReadU32Leb128(this,(uint32_t *)&local_68,"function index");
                  sVar5 = local_68._M_len;
                  if (RVar6.enum_ != Error) {
                    uVar4 = (uint)local_68._M_len;
                    if ((uint)local_68._M_len == uVar15) {
                      pcVar13 = "duplicate function name: %u";
LAB_001227a7:
                      uVar9 = (ulong)uVar15;
                      goto LAB_001227c5;
                    }
                    if (uVar15 < (uint)local_68._M_len || uVar15 == 0xffffffff) {
                      if ((uint)local_68._M_len <
                          this->num_function_signatures_ + this->num_func_imports_) {
                        RVar6 = ReadStr(this,&local_88,"function name");
                        if (RVar6.enum_ == Error) goto LAB_001228e3;
                        iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xac])
                                          (this->delegate_,sVar5 & 0xffffffff,local_88._M_len,
                                           local_88._M_str);
                        if (iVar7 == 0) goto code_r0x001224f5;
                        pcVar13 = "OnFunctionName callback failed";
                        break;
                      }
                      pcVar13 = "invalid function index: %u";
                    }
                    else {
                      pcVar13 = "function index out of order: %u";
                    }
LAB_001227bf:
                    uVar9 = (ulong)(uint)local_68._M_len;
LAB_001227c5:
                    PrintError(this,pcVar13,uVar9);
                  }
                  goto LAB_001228e3;
                }
              }
              goto LAB_001221e9;
            }
            pcVar13 = "OnFunctionNameSubsection callback failed";
            break;
          case 2:
            iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xad])
                              (this->delegate_,(ulong)local_9c,(ulong)local_98,uVar9);
            if (iVar7 == 0) {
              if (uVar9 != 0) {
                RVar6 = ReadCount(this,&local_a0,"function count");
                if (RVar6.enum_ == Error) goto LAB_001228e3;
                local_4c = local_a0;
                iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xae])();
                if (iVar7 != 0) {
                  pcVar13 = "OnLocalNameFunctionCount callback failed";
                  break;
                }
                uVar14 = local_9c;
                if (local_4c != 0) {
                  local_50 = 0;
                  uVar15 = 0xffffffff;
                  do {
                    RVar6 = ReadU32Leb128(this,(uint32_t *)&local_88,"function index");
                    if (RVar6.enum_ == Error) goto LAB_001228e3;
                    local_70 = (uint)local_88._M_len;
                    if (this->num_function_signatures_ + this->num_func_imports_ <=
                        (uint)local_88._M_len) {
                      pcVar13 = "invalid function index: %u";
LAB_00122869:
                      uVar9 = local_88._M_len & 0xffffffff;
                      goto LAB_001227c5;
                    }
                    if ((uint)local_88._M_len <= uVar15 && uVar15 != 0xffffffff) {
                      pcVar13 = "locals function index out of order: %u";
                      goto LAB_00122869;
                    }
                    RVar6 = ReadCount(this,&local_94,"local count");
                    uVar11 = local_94;
                    if (RVar6.enum_ == Error) goto LAB_001228e3;
                    iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xaf])
                                      (this->delegate_,(ulong)local_70);
                    if (iVar7 != 0) {
                      pcVar13 = "OnLocalNameLocalCount callback failed";
                      goto LAB_001228d9;
                    }
                    if (uVar11 != 0) {
                      uVar14 = 0xffffffff;
                      do {
                        local_88._M_len = 0;
                        local_88._M_str = (char *)0x0;
                        RVar6 = ReadU32Leb128(this,(uint32_t *)&local_68,"named index");
                        sVar5 = local_68._M_len;
                        if (RVar6.enum_ == Error) goto LAB_001228e3;
                        uVar15 = (uint)local_68._M_len;
                        if ((uint)local_68._M_len == uVar14) {
                          pcVar13 = "duplicate local index: %u";
                          local_68._M_len._0_4_ = uVar14;
                          goto LAB_001227bf;
                        }
                        if ((uint)local_68._M_len <= uVar14 && uVar14 != 0xffffffff) {
                          pcVar13 = "local index out of order: %u";
                          goto LAB_001227a7;
                        }
                        RVar6 = ReadStr(this,&local_88,"name");
                        if (RVar6.enum_ == Error) goto LAB_001228e3;
                        iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb0])
                                          (this->delegate_,(ulong)local_70,sVar5 & 0xffffffff,
                                           local_88._M_len,local_88._M_str);
                        if (iVar7 != 0) {
                          pcVar13 = "OnLocalName callback failed";
                          goto LAB_001228d9;
                        }
                        uVar11 = uVar11 - 1;
                        uVar14 = uVar15;
                      } while (uVar11 != 0);
                    }
                    local_50 = local_50 + 1;
                    uVar14 = local_9c;
                    uVar15 = local_70;
                  } while (local_50 != local_4c);
                }
              }
              goto LAB_001221e9;
            }
            pcVar13 = "OnLocalNameSubsection callback failed";
            break;
          default:
switchD_00122127_caseD_3:
            (this->state_).offset = uVar16;
            uVar14 = local_9c;
LAB_001221e9:
            if ((this->state_).offset != uVar16) {
              PrintError(this,"unfinished sub-section (expected end: 0x%zx)",uVar16);
              goto LAB_001228e3;
            }
            uVar14 = uVar14 + 1;
            this->read_end_ = local_90;
            uVar15 = local_34;
            if (local_90 <= uVar16) goto LAB_001225d1;
            goto LAB_00122074;
          case 4:
          case 5:
          case 6:
          case 7:
          case 8:
          case 9:
          case 0xb:
            if (uVar9 == 0) goto switchD_00122127_caseD_3;
            RVar6 = ReadCount(this,&local_a0,"name count");
            uVar14 = local_a0;
            if (RVar6.enum_ != Error) {
              iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb2])
                                (this->delegate_,(ulong)local_a0);
              if (iVar7 != 0) {
                pcVar13 = "OnNameCount callback failed";
                break;
              }
              for (; uVar14 != 0; uVar14 = uVar14 - 1) {
                local_88._M_len = 0;
                local_88._M_str = (char *)0x0;
                RVar6 = ReadU32Leb128(this,(uint32_t *)&local_68,"index");
                sVar5 = local_68._M_len;
                if ((RVar6.enum_ == Error) ||
                   (RVar6 = ReadStr(this,&local_88,"name"), RVar6.enum_ == Error))
                goto LAB_001228e3;
                iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb3])
                                  (this->delegate_,(ulong)uVar15,sVar5 & 0xffffffff,local_88._M_len,
                                   local_88._M_str);
                if (iVar7 != 0) {
                  pcVar13 = "OnNameEntry callback failed";
                  goto LAB_001228d9;
                }
              }
              goto switchD_00122127_caseD_3;
            }
            goto LAB_001228e3;
          }
LAB_001228d9:
          PrintError(this,pcVar13);
LAB_001228e3:
          this->read_end_ = local_90;
          goto LAB_00121b1e;
        }
LAB_001225d1:
        iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb4])();
        if (iVar7 != 0) {
          pcVar13 = "EndNamesSection callback failed";
          goto LAB_001225ed;
        }
        this->did_read_names_section_ = true;
        goto LAB_00122035;
      }
      pcVar13 = "BeginNamesSection callback failed";
LAB_001225ed:
      PrintError(this,pcVar13);
    }
    else {
      if (sVar5 != 6) {
        if ((sVar5 == 8) && (*(long *)pcVar13 == 0x302e6b6e696c7964)) {
          iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb9])(this->delegate_,section_size)
          ;
          if (iVar7 == 0) {
            if ((this->state_).offset < this->read_end_) {
LAB_00121be5:
              RVar6 = ReadU32Leb128(this,&local_98,"type");
              if ((RVar6.enum_ == Error) ||
                 (RVar6 = ReadU32Leb128(this,(uint32_t *)&local_88,"subsection size"),
                 RVar6.enum_ == Error)) goto LAB_00121b1e;
              uVar16 = (local_88._M_len & 0xffffffff) + (this->state_).offset;
              uVar9 = this->read_end_;
              if (uVar9 < uVar16) goto LAB_001226ba;
              this->read_end_ = uVar16;
              switch(local_98) {
              case 1:
                RVar6 = ReadU32Leb128(this,(uint32_t *)&local_88,"mem_size");
                if (((RVar6.enum_ != Error) &&
                    (RVar6 = ReadU32Leb128(this,(uint32_t *)&local_68,"mem_align"),
                    RVar6.enum_ != Error)) &&
                   ((RVar6 = ReadU32Leb128(this,&local_94,"table_size"), RVar6.enum_ != Error &&
                    (RVar6 = ReadU32Leb128(this,&local_6c,"table_align"), RVar6.enum_ != Error)))) {
                  iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xba])
                                    (this->delegate_,local_88._M_len & 0xffffffff,
                                     local_68._M_len & 0xffffffff,(ulong)local_94,(ulong)local_6c);
                  if (iVar7 == 0) goto LAB_00121f1c;
                  pcVar13 = "OnDylinkInfo callback failed";
LAB_0012282f:
                  PrintError(this,pcVar13);
                }
                break;
              case 2:
                RVar6 = ReadU32Leb128(this,&local_a0,"needed_dynlibs");
                if (RVar6.enum_ != Error) {
                  iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbf])
                                    (this->delegate_,(ulong)local_a0);
                  if (iVar7 != 0) {
                    pcVar13 = "OnDylinkNeededCount callback failed";
                    goto LAB_0012282f;
                  }
                  while (bVar17 = local_a0 != 0, local_a0 = local_a0 - 1, bVar17) {
                    local_88._M_len = 0;
                    local_88._M_str = (char *)0x0;
                    RVar6 = ReadStr(this,&local_88,"dylib so_name");
                    if (RVar6.enum_ == Error) goto LAB_00122839;
                    iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc0])
                                      (this->delegate_,local_88._M_len,local_88._M_str);
                    if (iVar7 != 0) {
                      pcVar13 = "OnDylinkNeeded callback failed";
                      goto LAB_0012282f;
                    }
                  }
                  goto LAB_00121f1c;
                }
                break;
              case 3:
                RVar6 = ReadU32Leb128(this,&local_a0,"count");
                if (RVar6.enum_ != Error) {
                  iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbc])
                                    (this->delegate_,(ulong)local_a0);
                  if (iVar7 != 0) {
                    pcVar13 = "OnDylinkExportCount callback failed";
                    goto LAB_0012282f;
                  }
                  if (local_a0 != 0) {
                    uVar14 = 0;
                    do {
                      local_68._M_len = local_68._M_len & 0xffffffff00000000;
                      local_88._M_len = 0;
                      local_88._M_str = (char *)0x0;
                      RVar6 = ReadStr(this,&local_88,"name");
                      if ((RVar6.enum_ == Error) ||
                         (RVar6 = ReadU32Leb128(this,(uint32_t *)&local_68,"flags"),
                         RVar6.enum_ == Error)) goto LAB_00122839;
                      iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbe])
                                        (this->delegate_,local_88._M_len,local_88._M_str,
                                         local_68._M_len & 0xffffffff);
                      if (iVar7 != 0) {
                        pcVar13 = "OnDylinkExport callback failed";
                        goto LAB_0012282f;
                      }
                      uVar14 = uVar14 + 1;
                    } while (uVar14 < local_a0);
                  }
                  goto LAB_00121f1c;
                }
                break;
              case 4:
                RVar6 = ReadU32Leb128(this,&local_a0,"count");
                if (RVar6.enum_ != Error) {
                  iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbb])
                                    (this->delegate_,(ulong)local_a0);
                  if (iVar7 != 0) {
                    pcVar13 = "OnDylinkImportCount callback failed";
                    goto LAB_0012282f;
                  }
                  if (local_a0 != 0) {
                    uVar14 = 0;
                    do {
                      local_94 = 0;
                      local_88._M_len = 0;
                      local_88._M_str = (char *)0x0;
                      local_68._M_len = 0;
                      local_68._M_str = (char *)0x0;
                      RVar6 = ReadStr(this,&local_88,"module");
                      if (((RVar6.enum_ == Error) ||
                          (RVar6 = ReadStr(this,&local_68,"field"), RVar6.enum_ == Error)) ||
                         (RVar6 = ReadU32Leb128(this,&local_94,"flags"), RVar6.enum_ == Error))
                      goto LAB_00122839;
                      iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbd])
                                        (this->delegate_,local_88._M_len,local_88._M_str,
                                         local_68._M_len,local_68._M_str,(ulong)local_94);
                      if (iVar7 != 0) {
                        pcVar13 = "OnDylinkImport callback failed";
                        goto LAB_0012282f;
                      }
                      uVar14 = uVar14 + 1;
                    } while (uVar14 < local_a0);
                  }
                  goto LAB_00121f1c;
                }
                break;
              default:
                (this->state_).offset = uVar16;
LAB_00121f1c:
                if ((this->state_).offset != uVar16) {
                  PrintError(this,"unfinished sub-section (expected end: 0x%zx)",uVar16);
                  break;
                }
                this->read_end_ = uVar9;
                if (uVar9 <= uVar16) goto LAB_00121f32;
                goto LAB_00121be5;
              }
LAB_00122839:
              this->read_end_ = uVar9;
              goto LAB_00121b1e;
            }
LAB_00121f32:
            iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc1])();
            if (iVar7 == 0) goto LAB_00122035;
            pcVar13 = "EndDylinkSection callback failed";
            goto LAB_001225ed;
          }
LAB_00122596:
          pcVar13 = "BeginDylinkSection callback failed";
          goto LAB_001225ed;
        }
LAB_00121f6e:
        sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::rfind(&local_48,"reloc",0,5);
        if (sVar8 == 0) {
          RVar6 = ReadRelocSection(this,section_size);
        }
        else if (local_48._M_len == 7) {
          if (*(int *)((long)local_48._M_str + 3) != 0x676e696b ||
              *(int *)local_48._M_str != 0x6b6e696c) goto LAB_00122000;
          RVar6 = ReadLinkingSection(this,section_size);
        }
        else if ((local_48._M_len == 0xf) &&
                (*(long *)((long)local_48._M_str + 7) == 0x7365727574616566 &&
                 *(long *)local_48._M_str == 0x665f746567726174)) {
          RVar6 = ReadTargetFeaturesSections(this,section_size);
        }
        else {
LAB_00122000:
          if (((this->options_->features).code_metadata_enabled_ != true) ||
             (sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::find
                                (&local_48,"metadata.code.",0,0xe), sVar8 != 0)) {
            (this->state_).offset = this->read_end_;
            goto LAB_00122035;
          }
          name._M_str = (char *)((long)local_48._M_str + 0xe);
          name._M_len = local_48._M_len - 0xe;
          RVar6 = ReadCodeMetadataSection(this,name,section_size);
        }
        EVar10 = Error;
        if (RVar6.enum_ == Error) goto LAB_00121b23;
LAB_00122035:
        iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[8])();
        if (iVar7 == 0) {
          EVar10 = Ok;
          goto LAB_00121b23;
        }
        pcVar13 = "EndCustomSection callback failed";
        goto LAB_001225ed;
      }
      if (*(short *)((long)pcVar13 + 4) != 0x6b6e || *(int *)pcVar13 != 0x696c7964)
      goto LAB_00121f6e;
      iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb9])(this->delegate_,section_size);
      if (iVar7 != 0) goto LAB_00122596;
      RVar6 = ReadU32Leb128(this,(uint32_t *)&local_68,"mem_size");
      if ((((RVar6.enum_ != Error) &&
           (RVar6 = ReadU32Leb128(this,&local_98,"mem_align"), RVar6.enum_ != Error)) &&
          (RVar6 = ReadU32Leb128(this,&local_a0,"table_size"), RVar6.enum_ != Error)) &&
         (RVar6 = ReadU32Leb128(this,&local_94,"table_align"), RVar6.enum_ != Error)) {
        iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xba])
                          (this->delegate_,local_68._M_len & 0xffffffff,(ulong)local_98,
                           (ulong)local_a0,(ulong)local_94);
        if (iVar7 == 0) {
          RVar6 = ReadU32Leb128(this,&local_6c,"needed_dynlibs");
          if (RVar6.enum_ == Error) goto LAB_00121b1e;
          iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbf])
                            (this->delegate_,(ulong)local_6c);
          if (iVar7 == 0) {
            bVar17 = local_6c != 0;
            local_6c = local_6c - 1;
            if (bVar17) {
              do {
                local_88._M_len = 0;
                local_88._M_str = (char *)0x0;
                RVar6 = ReadStr(this,&local_88,"dylib so_name");
                if (RVar6.enum_ == Error) goto LAB_00121b1e;
                iVar7 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc0])
                                  (this->delegate_,local_88._M_len,local_88._M_str);
                if (iVar7 != 0) {
                  pcVar13 = "OnDylinkNeeded callback failed";
                  goto LAB_001225ed;
                }
                bVar17 = local_6c != 0;
                local_6c = local_6c - 1;
              } while (bVar17);
            }
            goto LAB_00121f32;
          }
          pcVar13 = "OnDylinkNeededCount callback failed";
        }
        else {
          pcVar13 = "OnDylinkInfo callback failed";
        }
        goto LAB_001225ed;
      }
    }
  }
  else {
    pcVar13 = "BeginGenericCustomSection callback failed";
LAB_00121b02:
    PrintError(this,pcVar13);
    (this->state_).offset = local_78;
    (this->state_).data = (uint8_t *)local_88._M_len;
    (this->state_).size = (Offset)local_88._M_str;
  }
LAB_00121b1e:
  EVar10 = Error;
LAB_00121b23:
  this->reading_custom_section_ = bVar1;
  return (Result)EVar10;
code_r0x001224f5:
  uVar12 = uVar12 - 1;
  uVar14 = local_9c;
  uVar15 = uVar4;
  if (uVar12 == 0) goto LAB_001221e9;
  goto LAB_00122459;
LAB_001226ba:
  pcVar13 = "invalid sub-section size: extends past end";
  goto LAB_001225ed;
}

Assistant:

Result BinaryReader::ReadCustomSection(Index section_index,
                                       Offset section_size) {
  std::string_view section_name;
  CHECK_RESULT(ReadStr(&section_name, "section name"));
  CALLBACK(BeginCustomSection, section_index, section_size, section_name);
  ValueRestoreGuard<bool, &BinaryReader::reading_custom_section_> guard(this);
  reading_custom_section_ = true;

  {
    // Backtrack parser when scope ends
    ValueRestoreGuard<BinaryReaderDelegate::State, &BinaryReader::state_> guard(
        this);
    CHECK_RESULT(ReadGenericCustomSection(section_name, section_size));
  }

  if (options_.read_debug_names && section_name == WABT_BINARY_SECTION_NAME) {
    CHECK_RESULT(ReadNameSection(section_size));
    did_read_names_section_ = true;
  } else if (section_name == WABT_BINARY_SECTION_DYLINK0) {
    CHECK_RESULT(ReadDylink0Section(section_size));
  } else if (section_name == WABT_BINARY_SECTION_DYLINK) {
    CHECK_RESULT(ReadDylinkSection(section_size));
  } else if (section_name.rfind(WABT_BINARY_SECTION_RELOC, 0) == 0) {
    // Reloc sections always begin with "reloc."
    CHECK_RESULT(ReadRelocSection(section_size));
  } else if (section_name == WABT_BINARY_SECTION_TARGET_FEATURES) {
    CHECK_RESULT(ReadTargetFeaturesSections(section_size));
  } else if (section_name == WABT_BINARY_SECTION_LINKING) {
    CHECK_RESULT(ReadLinkingSection(section_size));
  } else if (options_.features.code_metadata_enabled() &&
             section_name.find(WABT_BINARY_SECTION_CODE_METADATA) == 0) {
    std::string_view metadata_name = section_name;
    metadata_name.remove_prefix(sizeof(WABT_BINARY_SECTION_CODE_METADATA) - 1);
    CHECK_RESULT(ReadCodeMetadataSection(metadata_name, section_size));
  } else {
    // Skip. This is a generic custom section, and is handled above.
    state_.offset = read_end_;
  }
  CALLBACK0(EndCustomSection);
  return Result::Ok;
}